

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_shaders.cpp
# Opt level: O2

void gen_phong_shade(float *cl,float *cp,float *l,float *e,float *n,int p,float *clambert)

{
  float fVar1;
  vec3 cphong;
  vec3 r;
  float local_48 [3];
  float local_3c [3];
  
  fVar1 = vec3_mul_inner(l,n);
  vec3_scale(local_3c,n,fVar1 + fVar1);
  vec3_sub(local_3c,local_3c,l);
  vec3_norm(local_3c,local_3c);
  fVar1 = vec3_mul_inner(e,local_3c);
  if (fVar1 <= 0.0) {
    fVar1 = 0.0;
  }
  fVar1 = fast_pow(fVar1,p);
  vec3_scale(local_48,cp,fVar1);
  vec3_fraction(local_48,cl,local_48);
  vec3_add(clambert,clambert,local_48);
  vec3_cull(clambert);
  return;
}

Assistant:

void gen_phong_shade(const vec3 cl, const vec3 cp, const vec3 l, const vec3 e, const vec3 n, const int p, vec3 clambert){
    //calculate r
    vec3 r;
    vec3_scale( r, n, 2.0f*vec3_mul_inner(l,n) );
    vec3_sub(r, r, l);
    vec3_norm(r,r);

    //calculate shade
    vec3 cphong;
    vec3_scale(cphong, cp, fast_pow(std::max(0.0f,vec3_mul_inner(e,r)),p));
    vec3_fraction(cphong, cl, cphong);
    vec3_add(clambert, clambert, cphong);
    vec3_cull(clambert);
}